

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool slang::ast::unpackConcatenation
               (StreamingConcatenationExpression *lhs,PackIterator *iter,PackIterator iterEnd,
               bitwidth_t *bitOffset,size_t *dynamicSize,EvalContext *context,
               SmallVectorBase<slang::ConstantValue> *dryRun)

{
  size_type sVar1;
  StreamingConcatenationExpression *lhs_00;
  Type *type;
  Expression *this;
  bool bVar2;
  _Storage<slang::ConstantRange,_true> range;
  Type *pTVar3;
  size_t sVar4;
  ulong uVar5;
  size_t unpackWidth;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar6;
  int iVar7;
  char *func;
  char cVar8;
  EVP_PKEY_CTX *ctx;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  bitwidth_t *pbVar9;
  long lVar10;
  int iVar11;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  optional<slang::ConstantRange> oVar12;
  bitwidth_t bit;
  ConstantValue cv;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  const_iterator iterConcat;
  size_t dynamicSizeSave;
  ConstantValue rvalue;
  SmallVector<slang::ConstantValue,_2UL> toBeOrdered;
  bool local_2d9;
  ulong local_2d8;
  bitwidth_t local_2a4;
  pointer local_2a0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_298;
  char local_278;
  char *local_270;
  undefined1 local_268 [32];
  __index_type local_248;
  pointer local_220;
  size_t local_218;
  long local_210;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_208;
  undefined1 local_1e0 [384];
  __index_type local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  sVar1 = (lhs->streams_).size_;
  local_2d9 = sVar1 == 0;
  if (!local_2d9) {
    local_2a0 = (lhs->streams_).data_;
    local_210 = sVar1 * 0x18;
    lVar10 = 0;
    local_270 = "dynamicSizeSave == dynamicSize";
    do {
      lhs_00 = *(StreamingConcatenationExpression **)((long)&(local_2a0->operand).ptr + lVar10);
      if (lhs_00 == (StreamingConcatenationExpression *)0x0) {
        func = 
        "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
        ;
LAB_002154ee:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,func);
      }
      if ((lhs_00->super_Expression).kind == Streaming) {
        if ((dryRun == (SmallVectorBase<slang::ConstantValue> *)0x0) && (lhs_00->sliceSize != 0)) {
          local_218 = *dynamicSize;
          local_1e0._0_8_ = local_1e0 + 0x18;
          local_1e0._8_8_ = 0;
          local_1e0._16_8_ = 2;
          ctx = (EVP_PKEY_CTX *)iter;
          bVar2 = unpackConcatenation(lhs_00,iter,iterEnd,bitOffset,dynamicSize,context,
                                      (SmallVectorBase<slang::ConstantValue> *)local_1e0);
          cVar8 = '\x01';
          if (bVar2) {
            std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
            vector<slang::ConstantValue*,void>
                      ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)
                       local_268,(ConstantValue *)local_1e0._0_8_,
                       (ConstantValue *)(local_1e0._0_8_ + local_1e0._8_8_ * 0x28),
                       (allocator_type *)&local_208);
            local_298._0_8_ = local_268._0_8_;
            local_298._8_8_ = local_268._8_8_;
            local_298._16_8_ = local_268._16_8_;
            local_268._0_8_ = (pointer)0x0;
            local_268._8_8_ = 0;
            local_268._16_8_ = 0;
            local_278 = '\x05';
            std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                      ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       local_268);
            sVar4 = lhs_00->sliceSize;
            unpackWidth = ConstantValue::bitstreamWidth((ConstantValue *)&local_298);
            Bitstream::reOrder((ConstantValue *)&local_208,(ConstantValue *)&local_298,sVar4,
                               unpackWidth);
            local_268._0_8_ = local_268 + 0x18;
            local_268._8_8_ = 0;
            local_268._16_8_ = 5;
            packBitstream((ConstantValue *)&local_208,
                          (SmallVectorBase<slang::ConstantValue_*> *)local_268);
            local_220 = (pointer)local_268._0_8_;
            local_2a4 = 0;
            ctx = (EVP_PKEY_CTX *)&local_220;
            bVar2 = unpackConcatenation(lhs_00,(PackIterator *)ctx,
                                        (PackIterator)(local_268._0_8_ + local_268._8_8_ * 8),
                                        &local_2a4,&local_218,context,
                                        (SmallVectorBase<slang::ConstantValue> *)0x0);
            cVar8 = '\x01';
            if (bVar2) {
              if (local_218 != *dynamicSize) {
                iVar11 = 0x2ac;
LAB_0021552a:
                assert::assertFailed
                          (local_270,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                           ,iVar11,
                           "bool slang::ast::unpackConcatenation(const StreamingConcatenationExpression &, PackIterator &, const PackIterator, bitwidth_t &, size_t &, EvalContext &, SmallVectorBase<ConstantValue> *)"
                          );
              }
              iVar11 = 0x2ad;
              if ((local_220 != (pointer)(local_268._8_8_ * 8 + local_268._0_8_)) ||
                 (cVar8 = '\0', local_2a4 != 0)) {
                local_270 = "iterConcat == std::cend(packed) && !bit";
                goto LAB_0021552a;
              }
            }
            if ((undefined1 *)local_268._0_8_ != local_268 + 0x18) {
              free((void *)local_268._0_8_);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_208);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_298);
          }
          SmallVectorBase<slang::ConstantValue>::cleanup
                    ((SmallVectorBase<slang::ConstantValue> *)local_1e0,ctx);
        }
        else {
          bVar2 = unpackConcatenation(lhs_00,iter,iterEnd,bitOffset,dynamicSize,context,dryRun);
          cVar8 = bVar2 * '\x02' + '\x01';
        }
      }
      else {
        type = (lhs_00->super_Expression).type.ptr;
        if (type == (Type *)0x0) {
          func = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_002154ee;
        }
        local_248 = '\0';
        this = *(Expression **)((long)&local_2a0->withExpr + lVar10);
        pbVar9 = bitOffset;
        if (this == (Expression *)0x0) {
          unpackBitstream((ConstantValue *)local_1e0,type,iter,iterEnd,bitOffset,dynamicSize);
          local_298._0_8_ = local_268;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
            ::_S_vtable._M_arr[(long)(char)local_1e0[0x20] + 1]._M_data)
                    ((anon_class_8_1_8991fb9c_conflict *)&local_298,
                     (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)local_1e0);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)local_1e0);
          range = (_Storage<slang::ConstantRange,_true>)0x0;
          local_2d8 = 0;
LAB_00215249:
          if (dryRun == (SmallVectorBase<slang::ConstantValue> *)0x0) {
            Expression::evalLValue((LValue *)local_1e0,&lhs_00->super_Expression,context);
            if (local_60 == '\0') {
              cVar8 = '\x01';
            }
            else {
              if (*(long *)((long)&local_2a0->withExpr + lVar10) != 0) {
                iVar11 = range._M_value.left;
                if (iVar11 != (int)local_2d8) {
                  if (type->canonical == (Type *)0x0) {
                    Type::resolveCanonical(type);
                  }
                  if (((type->canonical->super_Symbol).kind == QueueType) && (local_248 != '\b')) {
                    pvVar6 = std::
                             get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)local_268);
                    pTVar3 = (Type *)(pvVar6->
                                     super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                    elems.data_ = (pointer)(((long)(pvVar6->
                                                  super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pTVar3 >> 3) * -0x3333333333333333);
                    elems.size_ = (size_type)pbVar9;
                    constContainer((ConstantValue *)&local_298,(ast *)type,pTVar3,elems);
                    local_208._0_8_ = local_268;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                      ::_S_vtable._M_arr[(long)local_278 + 1]._M_data)
                              ((anon_class_8_1_8991fb9c_conflict *)&local_208,
                               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                *)&local_298);
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)&local_298);
                  }
                }
                pTVar3 = Type::getArrayElementType(type);
                bVar2 = Type::hasFixedRange(type);
                if (!bVar2) {
                  if ((int)local_2d8 < iVar11) {
                    assert::assertFailed
                              ("with.left <= with.right",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                               ,0x2e2,
                               "bool slang::ast::unpackConcatenation(const StreamingConcatenationExpression &, PackIterator &, const PackIterator, bitwidth_t &, size_t &, EvalContext &, SmallVectorBase<ConstantValue> *)"
                              );
                  }
                  LValue::load((ConstantValue *)&local_298,(LValue *)local_1e0);
                  sVar4 = ConstantValue::size((ConstantValue *)&local_298);
                  if (sVar4 <= local_2d8) {
                    Type::getDefaultValue((ConstantValue *)&local_58,pTVar3);
                    Bitstream::resizeToRange
                              ((ConstantValue *)&local_208,(ConstantValue *)&local_298,
                               (ConstantRange)(local_2d8 << 0x20),(ConstantValue *)&local_58,true);
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage(&local_58);
                    LValue::store((LValue *)local_1e0,(ConstantValue *)&local_208);
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)&local_208);
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)&local_298);
                }
                if (iVar11 == (int)local_2d8) {
                  Type::getDefaultValue((ConstantValue *)&local_298,pTVar3);
                  LValue::addIndex((LValue *)local_1e0,iVar11,(ConstantValue *)&local_298);
                }
                else {
                  Type::getDefaultValue((ConstantValue *)&local_298,pTVar3);
                  LValue::addArraySlice
                            ((LValue *)local_1e0,
                             (ConstantRange)((ulong)range & 0xffffffff | local_2d8 << 0x20),
                             (ConstantValue *)&local_298);
                }
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)&local_298);
              }
              cVar8 = '\0';
              LValue::store((LValue *)local_1e0,(ConstantValue *)local_268);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                                 *)local_1e0);
          }
          else {
            cVar8 = '\x03';
            SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
                      (dryRun,(ConstantValue *)local_268);
          }
        }
        else {
          oVar12 = Expression::evalSelector(this,context);
          range = oVar12.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload;
          cVar8 = '\x01';
          if (((undefined1  [12])
               oVar12.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) !=
              (undefined1  [12])0x0) {
            pTVar3 = Type::getArrayElementType(type);
            if (pTVar3 == (Type *)0x0) {
              assert::assertFailed
                        ("elemType",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                         ,699,
                         "bool slang::ast::unpackConcatenation(const StreamingConcatenationExpression &, PackIterator &, const PackIterator, bitwidth_t &, size_t &, EvalContext &, SmallVectorBase<ConstantValue> *)"
                        );
            }
            local_2d8._0_4_ =
                 oVar12.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
            if ((*dynamicSize != 0) &&
               ((&(local_2a0->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>.
                  _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged)[lVar10] == false
               )) {
              sVar4 = Type::bitstreamWidth(pTVar3);
              iVar7 = oVar12.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_ -
                      (int)local_2d8;
              iVar11 = -iVar7;
              if (0 < iVar7) {
                iVar11 = iVar7;
              }
              uVar5 = sVar4 * (iVar11 + 1);
              sVar4 = 0;
              if (uVar5 <= *dynamicSize) {
                sVar4 = *dynamicSize - uVar5;
              }
              *dynamicSize = sVar4;
            }
            if (oVar12.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_ ==
                (int)local_2d8) {
              this_00 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)local_1e0;
              unpackBitstream((ConstantValue *)this_00,pTVar3,iter,iterEnd,bitOffset,dynamicSize);
              local_298._0_8_ = local_268;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                ::_S_vtable._M_arr[(long)(char)local_1e0[0x20] + 1]._M_data)
                        ((anon_class_8_1_8991fb9c_conflict *)&local_298,
                         (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)this_00);
            }
            else {
              FixedSizeUnpackedArrayType::FixedSizeUnpackedArrayType
                        ((FixedSizeUnpackedArrayType *)local_1e0,pTVar3,range._M_value);
              this_00 = &local_298;
              unpackBitstream((ConstantValue *)this_00,(Type *)local_1e0,iter,iterEnd,bitOffset,
                              dynamicSize);
              local_208._0_8_ = local_268;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                ::_S_vtable._M_arr[(long)local_278 + 1]._M_data)
                        ((anon_class_8_1_8991fb9c_conflict *)&local_208,
                         (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)this_00);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)this_00);
            local_2d8 = (ulong)range >> 0x20;
            goto LAB_00215249;
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_268);
      }
      if (cVar8 == '\0') {
        cVar8 = '\0';
      }
      if ((cVar8 != '\x03') && (cVar8 != '\0')) {
        return local_2d9;
      }
      lVar10 = lVar10 + 0x18;
      local_2d9 = local_210 == lVar10;
    } while (!local_2d9);
  }
  return local_2d9;
}

Assistant:

static bool unpackConcatenation(const StreamingConcatenationExpression& lhs, PackIterator& iter,
                                const PackIterator iterEnd, bitwidth_t& bitOffset,
                                size_t& dynamicSize, EvalContext& context,
                                SmallVectorBase<ConstantValue>* dryRun = nullptr) {
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            auto& concat = operand.as<StreamingConcatenationExpression>();
            if (dryRun || !concat.sliceSize) {
                if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                         dryRun))
                    return false;
                continue;
            }

            // A dry run collects rvalue without storing lvalue
            size_t dynamicSizeSave = dynamicSize;
            SmallVector<ConstantValue> toBeOrdered;
            if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                     &toBeOrdered)) {
                return false;
            }

            // Re-order to a new rvalue with the slice size
            ConstantValue cv = std::vector(toBeOrdered.begin(), toBeOrdered.end());
            auto rvalue = Bitstream::reOrder(std::move(cv), concat.sliceSize, cv.bitstreamWidth());

            SmallVector<ConstantValue*> packed;
            packBitstream(rvalue, packed);

            // A real pass stores lvalue from new rvalue
            auto iterConcat = std::cbegin(packed);
            bitwidth_t bit = 0;
            if (!unpackConcatenation(concat, iterConcat, std::cend(packed), bit, dynamicSizeSave,
                                     context)) {
                return false;
            }

            ASSERT(dynamicSizeSave == dynamicSize);
            ASSERT(iterConcat == std::cend(packed) && !bit);
        }
        else {
            auto& arrayType = *operand.type;
            ConstantRange with;
            ConstantValue rvalue;
            if (stream.withExpr) {
                auto range = stream.withExpr->evalSelector(context);
                if (!range)
                    return false;

                with = *range;

                auto elemType = arrayType.getArrayElementType();
                ASSERT(elemType);

                if (dynamicSize > 0 && !stream.constantWithWidth) {
                    auto withSize = elemType->bitstreamWidth() * with.width();
                    if (withSize >= dynamicSize)
                        dynamicSize = 0;
                    else
                        dynamicSize -= withSize;
                }

                if (with.left == with.right) {
                    rvalue = unpackBitstream(*elemType, iter, iterEnd, bitOffset, dynamicSize);
                }
                else {
                    rvalue = unpackBitstream(FixedSizeUnpackedArrayType(*elemType, with), iter,
                                             iterEnd, bitOffset, dynamicSize);
                }
            }
            else {
                rvalue = unpackBitstream(arrayType, iter, iterEnd, bitOffset, dynamicSize);
            }

            if (dryRun) {
                dryRun->emplace_back(std::move(rvalue));
                continue;
            }

            LValue lvalue = operand.evalLValue(context);
            if (!lvalue)
                return false;

            if (stream.withExpr) {
                if (with.left != with.right && arrayType.isQueue() && !rvalue.isQueue())
                    rvalue = constContainer(arrayType, rvalue.elements());

                auto elemType = arrayType.getArrayElementType();
                if (!arrayType.hasFixedRange()) {
                    // When the array is a variable-size array, it shall be resized to
                    // accommodate the range expression.
                    ASSERT(with.left <= with.right);
                    auto oldValue = lvalue.load();
                    if (oldValue.size() <= static_cast<uint32_t>(with.right)) {
                        auto newValue = Bitstream::resizeToRange(std::move(oldValue),
                                                                 {0, with.right},
                                                                 elemType->getDefaultValue(), true);
                        lvalue.store(newValue);
                    }
                }

                if (with.left == with.right)
                    lvalue.addIndex(with.left, elemType->getDefaultValue());
                else
                    lvalue.addArraySlice(with, elemType->getDefaultValue());
            }

            lvalue.store(rvalue);
        }
    }

    return true;
}